

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::array<pbrt::Point3<float>,_3>::array
          (array<pbrt::Point3<float>,_3> *this,initializer_list<pbrt::Point3<float>_> v)

{
  initializer_list<pbrt::Point3<float>_> *piVar1;
  const_iterator pPVar2;
  undefined8 *puVar3;
  initializer_list<pbrt::Point3<float>_> *in_RDI;
  Point3<float> *val;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<pbrt::Point3<float>_> *__range2;
  size_t i;
  initializer_list<pbrt::Point3<float>_> *local_48;
  const_iterator local_30;
  long local_20;
  initializer_list<pbrt::Point3<float>_> local_10;
  
  piVar1 = in_RDI;
  do {
    local_48 = piVar1;
    memset(local_48,0,0xc);
    pbrt::Point3<float>::Point3((Point3<float> *)0x4e7d1e);
    piVar1 = (initializer_list<pbrt::Point3<float>_> *)((long)&local_48->_M_len + 4);
  } while (piVar1 != (initializer_list<pbrt::Point3<float>_> *)((long)&in_RDI[2]._M_array + 4));
  local_20 = 0;
  local_30 = std::initializer_list<pbrt::Point3<float>_>::begin(&local_10);
  pPVar2 = std::initializer_list<pbrt::Point3<float>_>::end(local_48);
  for (; local_30 != pPVar2; local_30 = local_30 + 1) {
    puVar3 = (undefined8 *)((long)&in_RDI->_M_array + local_20 * 0xc);
    *puVar3 = *(undefined8 *)&local_30->super_Tuple3<pbrt::Point3,_float>;
    *(float *)(puVar3 + 1) = (local_30->super_Tuple3<pbrt::Point3,_float>).z;
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

PBRT_CPU_GPU
    array(std::initializer_list<T> v) {
        size_t i = 0;
        for (const T &val : v)
            values[i++] = val;
    }